

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::UpdateSourceCodeInfo
          (OptionInterpreter *this,SourceCodeInfo *info)

{
  SourceCodeInfo_Location *from;
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  void **ppvVar5;
  iterator iVar6;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>_>
  *pVVar7;
  void **ppvVar8;
  pointer prVar9;
  int j;
  ulong uVar10;
  RepeatedField<int> *this_00;
  SourceCodeInfo_Location *from_00;
  int *piVar11;
  vector<int,_std::allocator<int>_> pathv;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> new_locs;
  iterator entry;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  RepeatedPtrFieldBase *local_90;
  RepeatedPtrFieldBase local_88;
  OptionInterpreter *local_68;
  SourceCodeInfo *local_60;
  SourceCodeInfo_Location *local_58;
  iterator local_50;
  iterator local_40;
  
  if (1 < *(size_t *)
           ((long)&(this->interpreted_paths_).
                   super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   .
                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                   value + 8)) {
    local_90 = &(info->field_0)._impl_.location_.super_RepeatedPtrFieldBase;
    local_88.tagged_rep_or_elem_ = (void *)0x0;
    local_88.current_size_ = 0;
    local_88.capacity_proxy_ = 0;
    local_88.arena_ = (Arena *)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68 = this;
    local_60 = info;
    ppvVar5 = internal::RepeatedPtrFieldBase::elements(local_90);
    local_68 = (OptionInterpreter *)&local_68->interpreted_paths_;
    bVar1 = false;
    from_00 = (SourceCodeInfo_Location *)0x0;
    for (; iVar6 = RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::end
                             ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
                              local_90), ppvVar5 != iVar6.it_; ppvVar5 = ppvVar5 + 1) {
      if ((bVar1) &&
         (iVar2 = RepeatedField<int>::size((RepeatedField<int> *)((long)*ppvVar5 + 0x18)),
         (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
         (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 2 <= (long)iVar2)) {
        uVar10 = 0;
        do {
          if ((ulong)((long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar10) {
            bVar1 = true;
            goto LAB_001ca442;
          }
          iVar3 = SourceCodeInfo_Location::path((SourceCodeInfo_Location *)*ppvVar5,(int)uVar10);
          piVar11 = local_a8._M_impl.super__Vector_impl_data._M_start + uVar10;
          uVar10 = uVar10 + 1;
        } while (iVar3 == *piVar11);
      }
      if (local_a8._M_impl.super__Vector_impl_data._M_finish !=
          local_a8._M_impl.super__Vector_impl_data._M_start) {
        local_a8._M_impl.super__Vector_impl_data._M_finish =
             local_a8._M_impl.super__Vector_impl_data._M_start;
      }
      for (iVar2 = 0;
          iVar4 = RepeatedField<int>::size((RepeatedField<int> *)((long)*ppvVar5 + 0x18)),
          iVar2 < iVar4; iVar2 = iVar2 + 1) {
        iVar3 = SourceCodeInfo_Location::path((SourceCodeInfo_Location *)*ppvVar5,iVar2);
        local_50.ctrl_._0_4_ = iVar3;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)&local_a8,(int *)&local_50);
      }
      local_50 = absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
                 ::find<std::vector<int,std::allocator<int>>>
                           ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
                             *)local_68,(key_arg<std::vector<int>_> *)&local_a8);
      local_40.ctrl_ = (ctrl_t *)0x0;
      bVar1 = absl::lts_20240722::container_internal::operator==(&local_50,&local_40);
      if (bVar1) {
        if (((ulong)from_00 & 1) != 0) {
          from = (SourceCodeInfo_Location *)*ppvVar5;
          pVVar7 = internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                             (&local_88);
          SourceCodeInfo_Location::CopyFrom(pVVar7,from);
        }
      }
      else {
        if (((ulong)from_00 & 1) == 0) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&local_88,*(int *)((long)&local_60->field_0 + 0x20));
          for (ppvVar8 = internal::RepeatedPtrFieldBase::elements(local_90); ppvVar8 != ppvVar5;
              ppvVar8 = ppvVar8 + 1) {
            from_00 = (SourceCodeInfo_Location *)*ppvVar8;
            pVVar7 = internal::RepeatedPtrFieldBase::
                     Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                               (&local_88);
            SourceCodeInfo_Location::CopyFrom(pVVar7,from_00);
          }
          from_00 = (SourceCodeInfo_Location *)CONCAT71((int7)((ulong)from_00 >> 8),1);
        }
        pVVar7 = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                           (&local_88);
        SourceCodeInfo_Location::CopyFrom(pVVar7,(SourceCodeInfo_Location *)*ppvVar5);
        this_00 = &(pVVar7->field_0)._impl_.path_;
        RepeatedField<int>::Clear(this_00);
        local_58 = from_00;
        prVar9 = absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::iterator::operator->(&local_50);
        for (piVar11 = (prVar9->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            prVar9 = absl::lts_20240722::container_internal::
                     raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::iterator::operator->(&local_50), from_00 = local_58,
            piVar11 !=
            (prVar9->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish; piVar11 = piVar11 + 1) {
          RepeatedField<int>::Add(this_00,*piVar11);
        }
      }
      bVar1 = !bVar1;
LAB_001ca442:
    }
    if (((ulong)from_00 & 1) != 0) {
      RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::operator=
                ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)local_90,
                 (RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)&local_88);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
    RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)&local_88);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::UpdateSourceCodeInfo(
    SourceCodeInfo* info) {
  if (interpreted_paths_.empty()) {
    // nothing to do!
    return;
  }

  // We find locations that match keys in interpreted_paths_ and
  // 1) replace the path with the corresponding value in interpreted_paths_
  // 2) remove any subsequent sub-locations (sub-location is one whose path
  //    has the parent path as a prefix)
  //
  // To avoid quadratic behavior of removing interior rows as we go,
  // we keep a copy. But we don't actually copy anything until we've
  // found the first match (so if the source code info has no locations
  // that need to be changed, there is zero copy overhead).

  RepeatedPtrField<SourceCodeInfo_Location>* locs = info->mutable_location();
  RepeatedPtrField<SourceCodeInfo_Location> new_locs;
  bool copying = false;

  std::vector<int> pathv;
  bool matched = false;

  for (RepeatedPtrField<SourceCodeInfo_Location>::iterator loc = locs->begin();
       loc != locs->end(); loc++) {
    if (matched) {
      // see if this location is in the range to remove
      bool loc_matches = true;
      if (loc->path_size() < static_cast<int64_t>(pathv.size())) {
        loc_matches = false;
      } else {
        for (size_t j = 0; j < pathv.size(); j++) {
          if (loc->path(j) != pathv[j]) {
            loc_matches = false;
            break;
          }
        }
      }

      if (loc_matches) {
        // don't copy this row since it is a sub-location that we're removing
        continue;
      }

      matched = false;
    }

    pathv.clear();
    for (int j = 0; j < loc->path_size(); j++) {
      pathv.push_back(loc->path(j));
    }

    auto entry = interpreted_paths_.find(pathv);

    if (entry == interpreted_paths_.end()) {
      // not a match
      if (copying) {
        *new_locs.Add() = *loc;
      }
      continue;
    }

    matched = true;

    if (!copying) {
      // initialize the copy we are building
      copying = true;
      new_locs.Reserve(locs->size());
      for (RepeatedPtrField<SourceCodeInfo_Location>::iterator it =
               locs->begin();
           it != loc; it++) {
        *new_locs.Add() = *it;
      }
    }

    // add replacement and update its path
    SourceCodeInfo_Location* replacement = new_locs.Add();
    *replacement = *loc;
    replacement->clear_path();
    for (std::vector<int>::iterator rit = entry->second.begin();
         rit != entry->second.end(); rit++) {
      replacement->add_path(*rit);
    }
  }

  // if we made a changed copy, put it in place
  if (copying) {
    *locs = std::move(new_locs);
  }
}